

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

size_t mdns_record_parse_txt
                 (void *buffer,size_t size,size_t offset,size_t length,mdns_record_txt_t *records,
                 size_t capacity)

{
  ulong uVar1;
  byte *pbVar2;
  ulong local_68;
  size_t c;
  size_t end;
  size_t sublength;
  size_t separator;
  char *strdata;
  size_t parsed;
  size_t capacity_local;
  mdns_record_txt_t *records_local;
  size_t length_local;
  size_t offset_local;
  size_t size_local;
  void *buffer_local;
  
  strdata = (char *)0x0;
  c = offset + length;
  length_local = offset;
  if (size < c) {
    c = size;
  }
  do {
    if (c <= length_local || capacity <= strdata) {
      return (size_t)strdata;
    }
    uVar1 = (ulong)*(byte *)((long)buffer + length_local);
    pbVar2 = (byte *)((long)buffer + length_local) + 1;
    length_local = uVar1 + 1 + length_local;
    sublength = 0;
    local_68 = 0;
    while( true ) {
      if (((uVar1 <= local_68) || ((char)pbVar2[local_68] < ' ')) || ('~' < (char)pbVar2[local_68]))
      goto LAB_002144c9;
      if (pbVar2[local_68] == 0x3d) break;
      local_68 = local_68 + 1;
    }
    sublength = local_68;
LAB_002144c9:
    if (sublength != 0) {
      if (sublength < uVar1) {
        records[(long)strdata].key.str = (char *)pbVar2;
        records[(long)strdata].key.length = sublength;
        records[(long)strdata].value.str = (char *)(pbVar2 + sublength + 1);
        records[(long)strdata].value.length = uVar1 - (sublength + 1);
      }
      else {
        records[(long)strdata].key.str = (char *)pbVar2;
        records[(long)strdata].key.length = uVar1;
      }
      strdata = strdata + 1;
    }
  } while( true );
}

Assistant:

size_t
mdns_record_parse_txt(const void* buffer, size_t size, size_t offset, size_t length,
                      mdns_record_txt_t* records, size_t capacity) {
	size_t parsed = 0;
	const char* strdata;
	size_t separator, sublength;
	size_t end = offset + length;

	if (size < end)
		end = size;

	while ((offset < end) && (parsed < capacity)) {
		strdata = (const char*)buffer + offset;
		sublength = *(const unsigned char*)strdata;

		++strdata;
		offset += sublength + 1;

		separator = 0;
		for (size_t c = 0; c < sublength; ++c) {
			//DNS-SD TXT record keys MUST be printable US-ASCII, [0x20, 0x7E]
			if ((strdata[c] < 0x20) || (strdata[c] > 0x7E))
				break;
			if (strdata[c] == '=') {
				separator = c;
				break;
			}
		}

		if (!separator)
			continue;

		if (separator < sublength) {
			records[parsed].key.str = strdata;
			records[parsed].key.length = separator;
			records[parsed].value.str = strdata + separator + 1;
			records[parsed].value.length = sublength - (separator + 1);
		}
		else {
			records[parsed].key.str = strdata;
			records[parsed].key.length = sublength;
		}

		++parsed;
	}

	return parsed;
}